

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<45ul,GF2::MOGrlex<45ul>>::ModGB<GF2::MOGrlex<45ul>>
          (MP<45UL,_GF2::MOGrlex<45UL>_> *this,MP<45UL,_GF2::MOGrlex<45UL>_> *polyRight)

{
  undefined1 uVar1;
  undefined1 uVar2;
  MM<45UL> *in_RDI;
  MP<45UL,_GF2::MOGrlex<45UL>_> poly;
  MM<45UL> lm;
  bool changed;
  Geobucket<4UL> gb;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  Geobucket<4UL> *in_stack_ffffffffffffff60;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_ffffffffffffff80;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_ffffffffffffff88;
  Geobucket<4UL> *in_stack_ffffffffffffff90;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_ffffffffffffff98;
  Geobucket<4UL> *in_stack_ffffffffffffffa0;
  byte local_41;
  
  MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::Geobucket
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  MP<45UL,_GF2::MOGrlex<45UL>_>::SetEmpty((MP<45UL,_GF2::MOGrlex<45UL>_> *)0x1deed8);
  local_41 = 0;
  MM<45UL>::MM((MM<45UL> *)0x1deee7);
  MP<45UL,_GF2::MOGrlex<45UL>_>::MP
            ((MP<45UL,_GF2::MOGrlex<45UL>_> *)in_stack_ffffffffffffff60,
             (MOGrlex<45UL> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  while (uVar1 = MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::PopLM
                           (in_stack_ffffffffffffff90,(MM<45UL> *)in_stack_ffffffffffffff88),
        (bool)uVar1) {
    MP<45UL,_GF2::MOGrlex<45UL>_>::LM((MP<45UL,_GF2::MOGrlex<45UL>_> *)in_stack_ffffffffffffff60);
    uVar2 = MM<45UL>::IsDivisibleBy
                      ((MM<45UL> *)in_stack_ffffffffffffff68,(MM<45UL> *)in_stack_ffffffffffffff60);
    if ((bool)uVar2) {
      local_41 = 1;
      in_stack_ffffffffffffff68 =
           MP<45UL,_GF2::MOGrlex<45UL>_>::operator=
                     ((MP<45UL,_GF2::MOGrlex<45UL>_> *)in_stack_ffffffffffffff60,
                      (MP<45UL,_GF2::MOGrlex<45UL>_> *)
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      MP<45UL,_GF2::MOGrlex<45UL>_>::PopLM((MP<45UL,_GF2::MOGrlex<45UL>_> *)0x1def77);
      MP<45UL,_GF2::MOGrlex<45UL>_>::LM((MP<45UL,_GF2::MOGrlex<45UL>_> *)in_stack_ffffffffffffff60);
      MM<45UL>::operator/=
                ((MM<45UL> *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff70)),
                 (MM<45UL> *)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff60 =
           (Geobucket<4UL> *)
           MP<45UL,_GF2::MOGrlex<45UL>_>::operator*=(in_stack_ffffffffffffff80,in_RDI);
      MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::SymDiffSplice
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    else {
      std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::push_back
                ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)
                 CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff70)),
                 (value_type *)in_stack_ffffffffffffff68);
    }
  }
  MP<45UL,_GF2::MOGrlex<45UL>_>::~MP((MP<45UL,_GF2::MOGrlex<45UL>_> *)0x1df00c);
  MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::~Geobucket(in_stack_ffffffffffffff60);
  return (bool)(local_41 & 1);
}

Assistant:

bool ModGB(const MP<_n, _O1>& polyRight)
	{	
		// поскольку операция выбора старшего монома задействована,
		// коэффициент роста geobucket выберем равным 4
		Geobucket<4> gb(*this);
		// будем сохранять в this остаток
		SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP poly(_order);
		while (gb.PopLM(lm))
			// делимость старших мономов?
			if (lm.IsDivisibleBy(polyRight.LM()))
			{
				changed = true;
				// готовим множитель
				(poly = polyRight).PopLM();
				// перемножаем и добавляем в geobucket
                gb.SymDiffSplice(poly *= (lm /= polyRight.LM()));
			}
			else
				// заносим lm в остаток
				push_back(lm);
		return changed;
	}